

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
write_str<char>(basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                *this,basic_string_view<char> s,format_specs *spec)

{
  char *s_00;
  size_t precision;
  size_t size;
  char *data;
  format_specs *spec_local;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this_local;
  basic_string_view<char> s_local;
  
  s_local.data_ = (char *)s.size_;
  this_local = (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
               s.data_;
  s_00 = basic_string_view<char>::data((basic_string_view<char> *)&this_local);
  precision = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
  if ((-1 < spec->precision_) && ((ulong)(long)spec->precision_ < precision)) {
    precision = (long)spec->precision_;
  }
  write_str<char>(this,s_00,precision,&spec->super_align_spec);
  return;
}

Assistant:

void basic_writer<Range>::write_str(
    basic_string_view<Char> s, const format_specs &spec) {
  const Char *data = s.data();
  std::size_t size = s.size();
  std::size_t precision = static_cast<std::size_t>(spec.precision_);
  if (spec.precision_ >= 0 && precision < size)
    size = precision;
  write_str(data, size, spec);
}